

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvAdvDiff_bnd.c
# Opt level: O1

int main(void)

{
  sunrealtype reltol;
  double dVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 *__ptr;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  sunrealtype abstol;
  sunrealtype umax;
  SUNContext sunctx;
  void *cvode_mem;
  SUNProfiler profobj;
  long nst;
  sunrealtype t;
  undefined8 local_78;
  void *local_70;
  double local_68;
  double local_60;
  double local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  
  local_70 = (void *)0x0;
  local_78 = 0;
  uVar2 = SUNContext_Create(0);
  if ((int)uVar2 < 0) {
    pcVar7 = "SUNContext_Create";
  }
  else {
    SUNContext_PopErrHandler(local_78);
    SUNContext_PushErrHandler(local_78,SUNAbortErrHandlerFn,0);
    SUNContext_PushErrHandler(local_78,SUNLogErrHandlerFn,0);
    uVar2 = SUNContext_GetProfiler(local_78,&local_48);
    if ((int)uVar2 < 0) {
      pcVar7 = "SUNContext_GetProfiler";
    }
    else {
      uVar3 = N_VNew_Serial(0x32,local_78);
      uVar2 = SUNContext_GetLastError(local_78);
      if ((int)uVar2 < 0) {
        pcVar7 = "N_VNew_Serial";
      }
      else {
        __ptr = (undefined8 *)malloc(0x30);
        if (__ptr == (undefined8 *)0x0) {
          main_cold_1();
          return 1;
        }
        *__ptr = 0x3fc745d1745d1746;
        __ptr[1] = 0x3fc5555555555555;
        *(undefined4 *)(__ptr + 2) = 0;
        *(undefined4 *)((long)__ptr + 0x14) = 0x403e4000;
        *(undefined4 *)(__ptr + 3) = 0;
        *(undefined4 *)((long)__ptr + 0x1c) = 0x3ff60000;
        __ptr[4] = 0x4042000000000000;
        __ptr[5] = local_48;
        lVar4 = N_VGetArrayPointer(uVar3);
        lVar9 = 1;
        do {
          local_60 = (double)(int)lVar9 * 0.16666666666666666;
          local_68 = 1.0 - local_60;
          iVar8 = 1;
          lVar10 = 0;
          do {
            dVar1 = (double)iVar8 * 0.18181818181818182;
            local_58 = (2.0 - dVar1) * dVar1 * local_60 * local_68;
            dVar1 = exp(dVar1 * 5.0 * local_60);
            umax = 2.0;
            *(double *)(lVar4 + lVar10) = dVar1 * local_58;
            lVar10 = lVar10 + 0x28;
            iVar8 = iVar8 + 1;
          } while (lVar10 != 400);
          lVar9 = lVar9 + 1;
          lVar4 = lVar4 + 8;
        } while (lVar9 != 6);
        local_70 = (void *)CVodeCreate(2,local_78);
        uVar2 = SUNContext_GetLastError(local_78);
        if ((int)uVar2 < 0) {
          pcVar7 = "CVodeCreate";
        }
        else {
          uVar2 = CVodeInit(0,local_70,f,uVar3);
          if ((int)uVar2 < 0) {
            pcVar7 = "CVodeInit";
          }
          else {
            abstol = 1e-05;
            uVar2 = CVodeSStolerances(0,local_70);
            if ((int)uVar2 < 0) {
              pcVar7 = "CVodeSStolerances";
            }
            else {
              uVar2 = CVodeSetUserData(local_70,__ptr);
              if ((int)uVar2 < 0) {
                pcVar7 = "CVodeSetUserData";
              }
              else {
                uVar5 = SUNBandMatrix(0x32,5,5,local_78);
                uVar2 = SUNContext_GetLastError(local_78);
                if ((int)uVar2 < 0) {
                  pcVar7 = "SUNBandMatrix";
                }
                else {
                  uVar6 = SUNLinSol_Band(uVar3,uVar5,local_78);
                  uVar2 = SUNContext_GetLastError(local_78);
                  if ((int)uVar2 < 0) {
                    pcVar7 = "SUNLinSol_Band";
                  }
                  else {
                    uVar2 = CVodeSetLinearSolver(local_70,uVar6,uVar5);
                    if ((int)uVar2 < 0) {
                      pcVar7 = "CVodeSetLinearSolver";
                    }
                    else {
                      uVar2 = CVodeSetJacFn(local_70,Jac);
                      if (-1 < (int)uVar2) {
                        local_68 = (double)uVar5;
                        local_50 = uVar6;
                        reltol = (sunrealtype)N_VMaxNorm(uVar3);
                        PrintHeader(reltol,abstol,umax);
                        dVar1 = 0.1;
                        iVar8 = 10;
                        do {
                          local_58 = dVar1;
                          uVar2 = CVode(local_70,uVar3,local_38,1);
                          if ((int)uVar2 < 0) {
                            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                                    "CVode",(ulong)uVar2);
                            break;
                          }
                          local_60 = (double)N_VMaxNorm(uVar3);
                          uVar2 = CVodeGetNumSteps(local_70,&local_40);
                          if ((int)uVar2 < 0) {
                            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                                    "CVodeGetNumSteps",(ulong)uVar2);
                          }
                          printf("At t = %4.2f   max.norm(u) =%14.6e   nst = %4ld\n",local_38._0_4_,
                                 local_60,local_40);
                          dVar1 = local_58 + 0.1;
                          iVar8 = iVar8 + -1;
                        } while (iVar8 != 0);
                        PrintFinalStats(local_70);
                        N_VDestroy(uVar3);
                        CVodeFree(&local_70);
                        SUNLinSolFree(local_50);
                        SUNMatDestroy(local_68);
                        free(__ptr);
                        SUNContext_Free(&local_78);
                        return 0;
                      }
                      pcVar7 = "CVodeSetJacFn";
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar7,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  sunrealtype dx, dy, reltol, abstol, t, tout, umax;
  N_Vector u;
  UserData data;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int iout, retval;
  long int nst;
  SUNContext sunctx;
  SUNProfiler profobj;

  /* Initialize variables */
  u         = NULL;
  data      = NULL;
  A         = NULL;
  LS        = NULL;
  cvode_mem = NULL;
  sunctx    = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(retval, "SUNContext_Create")) { return (1); }

  /* Setup different error handler stack so that we abort after logging */
  SUNContext_PopErrHandler(sunctx);
  SUNContext_PushErrHandler(sunctx, SUNAbortErrHandlerFn, NULL);
  SUNContext_PushErrHandler(sunctx, SUNLogErrHandlerFn, NULL);

  /* Get a reference to the profiler */
  retval = SUNContext_GetProfiler(sunctx, &profobj);
  if (check_retval(retval, "SUNContext_GetProfiler")) { return (1); }

  SUNDIALS_MARK_FUNCTION_BEGIN(profobj);

  /* Create a serial vector */

  u = N_VNew_Serial(NEQ, sunctx); /* Allocate u vector */
  if (check_retval(SUNContext_GetLastError(sunctx), "N_VNew_Serial"))
  {
    return (1);
  }

  reltol = ZERO; /* Set the tolerances */
  abstol = ATOL;

  data = (UserData)malloc(sizeof *data); /* Allocate data memory */
  if (!data)
  {
    fprintf(stderr, "MEMORY_ERROR: malloc failed - returned NULL pointer\n");
    return 1;
  }

  dx = data->dx = XMAX / (MX + 1); /* Set grid coefficients in data */
  dy = data->dy = YMAX / (MY + 1);
  data->hdcoef  = ONE / (dx * dx);
  data->hacoef  = HALF / (TWO * dx);
  data->vdcoef  = ONE / (dy * dy);
  data->profobj = profobj;

  SUNDIALS_MARK_BEGIN(profobj, "Setup");

  SetIC(u, data); /* Initialize u vector */

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */

  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval(SUNContext_GetLastError(sunctx), "CVodeCreate"))
  {
    return (1);
  }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the inital time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(retval, "CVodeInit")) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerance */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(retval, "CVodeSStolerances")) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(retval, "CVodeSetUserData")) { return (1); }

  /* Create banded SUNMatrix for use in linear solves -- since this will be factored,
     set the storage bandwidth to be the sum of upper and lower bandwidths */
  A = SUNBandMatrix(NEQ, MY, MY, sunctx);
  if (check_retval(SUNContext_GetLastError(sunctx), "SUNBandMatrix"))
  {
    return (1);
  }

  /* Create banded SUNLinearSolver object for use by CVode */
  LS = SUNLinSol_Band(u, A, sunctx);
  if (check_retval(SUNContext_GetLastError(sunctx), "SUNLinSol_Band"))
  {
    return (1);
  }

  /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(retval, "CVodeSetLinearSolver")) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(retval, "CVodeSetJacFn")) { return (1); }

  SUNDIALS_MARK_END(profobj, "Setup");

  /* In loop over output points: call CVode, print results, test for errors */

  SUNDIALS_MARK_BEGIN(profobj, "Integration loop");
  umax = N_VMaxNorm(u);
  PrintHeader(reltol, abstol, umax);
  for (iout = 1, tout = T1; iout <= NOUT; iout++, tout += DTOUT)
  {
    retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
    if (check_retval(retval, "CVode")) { break; }
    umax   = N_VMaxNorm(u);
    retval = CVodeGetNumSteps(cvode_mem, &nst);
    check_retval(retval, "CVodeGetNumSteps");
    PrintOutput(t, umax, nst);
  }
  SUNDIALS_MARK_END(profobj, "Integration loop");
  PrintFinalStats(cvode_mem); /* Print some final statistics   */

  N_VDestroy(u);         /* Free the u vector          */
  CVodeFree(&cvode_mem); /* Free the integrator memory */
  SUNLinSolFree(LS);     /* Free linear solver memory  */
  SUNMatDestroy(A);      /* Free the matrix memory     */
  free(data);            /* Free the user data         */

  SUNDIALS_MARK_FUNCTION_END(profobj);
  SUNContext_Free(&sunctx);
  return (0);
}